

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# additional.cpp
# Opt level: O0

BN * Garner(BN *__return_storage_ptr__,vector<BN,_std::allocator<BN>_> *m,
           vector<BN,_std::allocator<BN>_> *v)

{
  allocator<BN> *this;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  invalid_argument *this_00;
  reference pvVar4;
  const_reference pvVar5;
  const_reference bn;
  BN local_1e0;
  BN local_1c8;
  BN local_1b0;
  BN local_198;
  byte local_179;
  BN local_178;
  undefined1 local_160 [8];
  BN vix;
  BN xmi;
  undefined1 local_128 [4];
  int i_1;
  BN Pm;
  BN local_108;
  BN local_f0;
  BN local_d8;
  BN local_c0;
  BN local_a8;
  int local_8c;
  undefined1 local_88 [4];
  int j;
  int local_6c;
  undefined1 local_68 [4];
  int i;
  BN u;
  undefined1 local_48 [8];
  vector<BN,_std::allocator<BN>_> C;
  int t;
  vector<BN,_std::allocator<BN>_> *v_local;
  vector<BN,_std::allocator<BN>_> *m_local;
  BN *x;
  
  sVar2 = std::vector<BN,_std::allocator<BN>_>::size(m);
  sVar3 = std::vector<BN,_std::allocator<BN>_>::size(v);
  if (sVar2 == sVar3) {
    sVar2 = std::vector<BN,_std::allocator<BN>_>::size(m);
    C.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_end_of_storage.
    _0_4_ = (int)sVar2;
    sVar2 = (size_type)
            (int)C.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage;
    this = (allocator<BN> *)
           ((long)&u.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<BN>::allocator(this);
    std::vector<BN,_std::allocator<BN>_>::vector
              ((vector<BN,_std::allocator<BN>_> *)local_48,sVar2,this);
    std::allocator<BN>::~allocator
              ((allocator<BN> *)
               ((long)&u.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    BN::BN((BN *)local_68);
    for (local_6c = 1;
        local_6c <
        (int)C.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage; local_6c = local_6c + 1) {
      BN::bn1();
      pvVar4 = std::vector<BN,_std::allocator<BN>_>::operator[]
                         ((vector<BN,_std::allocator<BN>_> *)local_48,(long)local_6c);
      BN::operator=(pvVar4,(BN *)local_88);
      BN::~BN((BN *)local_88);
      for (local_8c = 0; local_8c < local_6c; local_8c = local_8c + 1) {
        pvVar5 = std::vector<BN,_std::allocator<BN>_>::operator[](m,(long)local_8c);
        BN::BN(&local_c0,pvVar5);
        pvVar5 = std::vector<BN,_std::allocator<BN>_>::operator[](m,(long)local_6c);
        BN::BN(&local_d8,pvVar5);
        gcdInverseEuclideanBinary(&local_a8,&local_c0,&local_d8);
        BN::operator=((BN *)local_68,&local_a8);
        BN::~BN(&local_a8);
        BN::~BN(&local_d8);
        BN::~BN(&local_c0);
        pvVar4 = std::vector<BN,_std::allocator<BN>_>::operator[]
                           ((vector<BN,_std::allocator<BN>_> *)local_48,(long)local_6c);
        BN::operator*(&local_108,(BN *)local_68,pvVar4);
        pvVar5 = std::vector<BN,_std::allocator<BN>_>::operator[](m,(long)local_6c);
        BN::operator%(&local_f0,&local_108,pvVar5);
        pvVar4 = std::vector<BN,_std::allocator<BN>_>::operator[]
                           ((vector<BN,_std::allocator<BN>_> *)local_48,(long)local_6c);
        BN::operator=(pvVar4,&local_f0);
        BN::~BN(&local_f0);
        BN::~BN(&local_108);
      }
    }
    pvVar5 = std::vector<BN,_std::allocator<BN>_>::operator[](v,0);
    BN::operator=((BN *)local_68,pvVar5);
    Pm.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    BN::BN(__return_storage_ptr__,(BN *)local_68);
    BN::bn1();
    for (xmi.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
        xmi.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ <
        (int)C.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
        xmi.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             xmi.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      pvVar5 = std::vector<BN,_std::allocator<BN>_>::operator[]
                         (m,(long)xmi.ba.
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      BN::operator%((BN *)&vix.ba.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,__return_storage_ptr__,
                    pvVar5);
      pvVar5 = std::vector<BN,_std::allocator<BN>_>::operator[]
                         (v,(long)xmi.ba.
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      bVar1 = BN::operator>=(pvVar5,(BN *)&vix.ba.
                                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_179 = 0;
      if (bVar1) {
        pvVar5 = std::vector<BN,_std::allocator<BN>_>::operator[]
                           (v,(long)xmi.ba.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        BN::operator-((BN *)local_160,pvVar5,
                      (BN *)&vix.ba.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        pvVar5 = std::vector<BN,_std::allocator<BN>_>::operator[]
                           (m,(long)xmi.ba.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        bn = std::vector<BN,_std::allocator<BN>_>::operator[]
                       (v,(long)xmi.ba.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        BN::operator+(&local_178,pvVar5,bn);
        local_179 = 1;
        BN::operator-((BN *)local_160,&local_178,
                      (BN *)&vix.ba.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      if ((local_179 & 1) != 0) {
        BN::~BN(&local_178);
      }
      pvVar4 = std::vector<BN,_std::allocator<BN>_>::operator[]
                         ((vector<BN,_std::allocator<BN>_> *)local_48,
                          (long)xmi.ba.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      BN::operator*(&local_1b0,(BN *)local_160,pvVar4);
      pvVar5 = std::vector<BN,_std::allocator<BN>_>::operator[]
                         (m,(long)xmi.ba.
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      BN::operator%(&local_198,&local_1b0,pvVar5);
      BN::operator=((BN *)local_68,&local_198);
      BN::~BN(&local_198);
      BN::~BN(&local_1b0);
      pvVar5 = std::vector<BN,_std::allocator<BN>_>::operator[]
                         (m,(long)(xmi.ba.
                                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + -1));
      BN::operator*(&local_1c8,(BN *)local_128,pvVar5);
      BN::operator=((BN *)local_128,&local_1c8);
      BN::~BN(&local_1c8);
      BN::operator*(&local_1e0,(BN *)local_68,(BN *)local_128);
      BN::operator+=(__return_storage_ptr__,&local_1e0);
      BN::~BN(&local_1e0);
      BN::~BN((BN *)local_160);
      BN::~BN((BN *)&vix.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    Pm.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    BN::~BN((BN *)local_128);
    if ((Pm.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
      BN::~BN(__return_storage_ptr__);
    }
    BN::~BN((BN *)local_68);
    std::vector<BN,_std::allocator<BN>_>::~vector((vector<BN,_std::allocator<BN>_> *)local_48);
    return __return_storage_ptr__;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Garner: Sizes of arrays are different");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

BN Garner(const std::vector <BN>& m, const std::vector <BN>& v)
{
    if(m.size()!=v.size())
        throw invalid_argument("Garner: Sizes of arrays are different");
    int t = m.size();
    vector<BN> C(t);
    BN u;
    for(int i=1;i<t;i++)
    {
        C[i] = BN::bn1();
        for(int j=0; j<i; j++)
        {
            u = gcdInverseEuclideanBinary(m[j],m[i]);
            C[i] = u * C[i] % m[i];
        }
    }
    u = v[0];
    BN x = u;
    BN Pm(BN::bn1());
    for(int i=1;i<t;i++)
    {
        BN xmi = x%m[i];
        BN vix = (v[i] >= xmi ? v[i] - xmi : m[i] + v[i] - xmi);
        //u = (v[i] - x) * C[i] % m[i];
        u = vix * C[i] % m[i];
        Pm = Pm * m[i-1];
        x += u * Pm;
    }
    return x;
}